

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O0

void * __thiscall CHeap::AllocateFromChunk(CHeap *this,uint Size)

{
  char *pMem;
  uint Size_local;
  CHeap *this_local;
  char *local_8;
  
  if (this->m_pCurrent->m_pEnd < this->m_pCurrent->m_pCurrent + Size) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = this->m_pCurrent->m_pCurrent;
    this->m_pCurrent->m_pCurrent = this->m_pCurrent->m_pCurrent + Size;
  }
  return local_8;
}

Assistant:

void *CHeap::AllocateFromChunk(unsigned int Size)
{
	// check if we need can fit the allocation
	if(m_pCurrent->m_pCurrent + Size > m_pCurrent->m_pEnd)
		return (void*)0x0;

	// get memory and move the pointer forward
	char *pMem = m_pCurrent->m_pCurrent;
	m_pCurrent->m_pCurrent += Size;
	return pMem;
}